

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

bool llvm::ARM::getFPUFeatures
               (uint FPUKind,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  int iVar1;
  long lVar2;
  StringRef local_38;
  
  if (0x14 < FPUKind - 1) goto LAB_0017126e;
  lVar2 = (ulong)FPUKind * 0x20;
  iVar1 = *(int *)(&DAT_001c360c + lVar2);
  if (iVar1 == 0) {
    local_38.Data = "-fp-only-sp";
    local_38.Length = 0xb;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_38);
    local_38.Data = "-d16";
LAB_001710c5:
    local_38.Length = 4;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_38);
  }
  else {
    if (iVar1 == 1) {
      local_38.Data = "-fp-only-sp";
LAB_0017107c:
      local_38.Length = 0xb;
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (Features,&local_38);
      local_38.Data = "+d16";
      goto LAB_001710c5;
    }
    if (iVar1 == 2) {
      local_38.Data = "+fp-only-sp";
      goto LAB_0017107c;
    }
  }
  switch(*(undefined4 *)(&DAT_001c3604 + lVar2)) {
  case 0:
    local_38.Data = "-vfp2";
    break;
  case 1:
    local_38.Data = "+vfp2";
    break;
  case 2:
    local_38.Data = "+vfp3";
    goto LAB_0017118d;
  case 3:
    local_38.Data = "+vfp3";
    local_38.Length = 5;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_38);
    local_38.Data = "+fp16";
    goto LAB_0017119f;
  case 4:
    local_38.Data = "+vfp4";
    goto LAB_001711c5;
  case 5:
    local_38.Data = "+fp-armv8";
    goto LAB_001711e5;
  default:
    goto switchD_001710f7_default;
  }
  local_38.Length = 5;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_38);
  local_38.Data = "-vfp3";
LAB_0017118d:
  local_38.Length = 5;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_38);
  local_38.Data = "-fp16";
LAB_0017119f:
  local_38.Length = 5;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_38);
  local_38.Data = "-vfp4";
LAB_001711c5:
  local_38.Length = 5;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_38);
  local_38.Data = "-fp-armv8";
LAB_001711e5:
  local_38.Length = 9;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_38);
switchD_001710f7_default:
  iVar1 = *(int *)(&DAT_001c3608 + lVar2);
  if (iVar1 == 0) {
    local_38.Data = "-neon";
LAB_00171238:
    local_38.Length = 5;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_38);
    local_38.Data = "-crypto";
  }
  else {
    if (iVar1 == 1) {
      local_38.Data = "+neon";
      goto LAB_00171238;
    }
    if (iVar1 != 2) goto LAB_0017126e;
    local_38.Data = "+neon";
    local_38.Length = 5;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_38);
    local_38.Data = "+crypto";
  }
  local_38.Length = 7;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_38);
LAB_0017126e:
  return FPUKind - 1 < 0x15;
}

Assistant:

bool llvm::ARM::getFPUFeatures(unsigned FPUKind,
                               std::vector<StringRef> &Features) {

  if (FPUKind >= ARM::FK_LAST || FPUKind == ARM::FK_INVALID)
    return false;

  // fp-only-sp and d16 subtarget features are independent of each other, so we
  // must enable/disable both.
  switch (FPUNames[FPUKind].Restriction) {
  case ARM::FPURestriction::SP_D16:
    Features.push_back("+fp-only-sp");
    Features.push_back("+d16");
    break;
  case ARM::FPURestriction::D16:
    Features.push_back("-fp-only-sp");
    Features.push_back("+d16");
    break;
  case ARM::FPURestriction::None:
    Features.push_back("-fp-only-sp");
    Features.push_back("-d16");
    break;
  }

  // FPU version subtarget features are inclusive of lower-numbered ones, so
  // enable the one corresponding to this version and disable all that are
  // higher. We also have to make sure to disable fp16 when vfp4 is disabled,
  // as +vfp4 implies +fp16 but -vfp4 does not imply -fp16.
  switch (FPUNames[FPUKind].FPUVersion) {
  case ARM::FPUVersion::VFPV5:
    Features.push_back("+fp-armv8");
    break;
  case ARM::FPUVersion::VFPV4:
    Features.push_back("+vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV3_FP16:
    Features.push_back("+vfp3");
    Features.push_back("+fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV3:
    Features.push_back("+vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::VFPV2:
    Features.push_back("+vfp2");
    Features.push_back("-vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  case ARM::FPUVersion::NONE:
    Features.push_back("-vfp2");
    Features.push_back("-vfp3");
    Features.push_back("-fp16");
    Features.push_back("-vfp4");
    Features.push_back("-fp-armv8");
    break;
  }

  // crypto includes neon, so we handle this similarly to FPU version.
  switch (FPUNames[FPUKind].NeonSupport) {
  case ARM::NeonSupportLevel::Crypto:
    Features.push_back("+neon");
    Features.push_back("+crypto");
    break;
  case ARM::NeonSupportLevel::Neon:
    Features.push_back("+neon");
    Features.push_back("-crypto");
    break;
  case ARM::NeonSupportLevel::None:
    Features.push_back("-neon");
    Features.push_back("-crypto");
    break;
  }

  return true;
}